

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeekData.cpp
# Opt level: O1

void __thiscall
WeekData::WeekData(WeekData *this,string *path,int numberOfShifts,int numberOfSkills)

{
  value_t vVar1;
  json_value jVar2;
  reference this_00;
  json j;
  Exception exception;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  
  (this->scenario)._M_dataplus._M_p = (pointer)&(this->scenario).field_2;
  (this->scenario)._M_string_length = 0;
  (this->scenario).field_2._M_local_buf[0] = '\0';
  (this->shiftOffRequests).super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shiftOffRequests).super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shiftOffRequests).super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->requirements)._M_h._M_buckets = &(this->requirements)._M_h._M_single_bucket;
  (this->requirements)._M_h._M_bucket_count = 1;
  (this->requirements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->requirements)._M_h._M_element_count = 0;
  (this->requirements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->requirements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->requirements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_80.m_type = null;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_80);
  this->numberOfShifts = numberOfShifts;
  this->numberOfSkills = numberOfSkills;
  Reader::ReadJSONFile((Reader *)&local_40,path);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_40);
  jVar2 = local_80.m_value;
  vVar1 = local_80.m_type;
  local_80.m_type = local_40.m_type;
  local_40.m_type = vVar1;
  local_80.m_value = local_40.m_value;
  local_40.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_40);
  this_00 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)&local_80,"scenario");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_70,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  parseRequirements(this,&local_80);
  parseShiftOffRequests(this,&local_80);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_80);
  return;
}

Assistant:

WeekData::WeekData(const string &path, int numberOfShifts, int numberOfSkills) {
    json j;

    this->numberOfShifts = numberOfShifts;
    this->numberOfSkills = numberOfSkills;

    try {
        j = Reader::ReadJSONFile(path);
    } catch (Exception exception) {
        exception.printErr();
        return;
    }

    scenario = j["scenario"];

    parseRequirements(j);

    parseShiftOffRequests(j);
}